

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O0

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0>::do_update
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0> *this)

{
  sc_signal_channel *in_RDI;
  
  sc_signal_channel::do_update(in_RDI);
  sc_dt::sc_logic::operator=
            ((sc_logic *)&in_RDI[1].super_sc_prim_channel.super_sc_object.m_child_objects,
             (sc_logic *)
             ((long)&in_RDI[1].super_sc_prim_channel.super_sc_object.m_child_objects.
                     super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4));
  return;
}

Assistant:

inline void
sc_signal_t<T,POL>::do_update()
{
    base_type::do_update();
    m_cur_val = m_new_val;
}